

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

void __thiscall
sophia_interface::LUROBO
          (sophia_interface *this,double THE,double PHI,double BEX,double BEY,double BEZ)

{
  int IMIN;
  int IMAX;
  
  IMIN = MSTU[0];
  if (-1 < MSTU[0]) {
    IMIN = 1;
  }
  IMAX = MSTU[1];
  if (-1 < MSTU[1]) {
    IMAX = this->N;
  }
  LUDBRB(this,IMIN,IMAX,THE,PHI,BEX,BEY,BEZ,true);
  return;
}

Assistant:

void sophia_interface::LUROBO(double THE, double PHI, double BEX, double BEY, double BEZ) {
// Purpose: to perform rotations and boosts.
    // Find range of rotation/boost. Convert boost to double precision.
    int IMIN = 1;
    if (MSTU[0] < 0) IMIN = MSTU[0];
    int IMAX = N;
    if (MSTU[1] < 0) IMAX = MSTU[1];
    bool skip = true;
    LUDBRB(IMIN, IMAX, THE, PHI, BEX, BEY, BEZ, skip);
}